

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

shared_ptr<duckdb::LocalTableStorage,_true> __thiscall
duckdb::LocalTableManager::MoveEntry(LocalTableManager *this,DataTable *table)

{
  const_iterator __it;
  undefined8 uVar1;
  int iVar2;
  __node_base_ptr p_Var3;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __hash_code __code;
  shared_ptr<duckdb::LocalTableStorage,_true> sVar4;
  key_type local_28;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)table);
  if (iVar2 == 0) {
    p_Var3 = ::std::
             _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&table->column_definitions,
                        in_RDX % (ulong)(table->column_definitions).
                                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                        .
                                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,&local_28,in_RDX)
    ;
    if ((p_Var3 == (__node_base_ptr)0x0) ||
       (__it.
        super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
                   )p_Var3->_M_nxt,
       __it.
       super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
       ._M_cur == (__node_type *)0x0)) {
      (this->table_storage_lock).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this->table_storage_lock).super___mutex_base._M_mutex + 8) = 0;
    }
    else {
      (this->table_storage_lock).super___mutex_base._M_mutex.__align =
           *(long *)((long)__it.
                           super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
                           ._M_cur + 0x10);
      uVar1 = *(undefined8 *)
               ((long)__it.
                      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
                      ._M_cur + 0x18);
      *(undefined8 *)
       ((long)__it.
              super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
              ._M_cur + 0x18) = 0;
      *(undefined8 *)((long)&(this->table_storage_lock).super___mutex_base._M_mutex + 8) = uVar1;
      *(undefined8 *)
       ((long)__it.
              super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_true>
              ._M_cur + 0x10) = 0;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase((_Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&table->column_definitions,__it);
    }
    pthread_mutex_unlock((pthread_mutex_t *)table);
    sVar4.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar4.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)this;
    return (shared_ptr<duckdb::LocalTableStorage,_true>)
           sVar4.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

shared_ptr<LocalTableStorage> LocalTableManager::MoveEntry(DataTable &table) {
	lock_guard<mutex> l(table_storage_lock);
	auto entry = table_storage.find(table);
	if (entry == table_storage.end()) {
		return nullptr;
	}
	auto storage_entry = std::move(entry->second);
	table_storage.erase(entry);
	return storage_entry;
}